

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O1

void undo_perm64(uchar *mat,int *P,int n)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  undefined8 uVar7;
  ulong uVar8;
  int j;
  ulong uVar9;
  ulong uVar10;
  uchar *puVar11;
  
  if (0 < n) {
    uVar3 = (uint)n >> 6;
    uVar4 = (ulong)(uint)n;
    puVar6 = mat + (uVar4 - 1) * (ulong)uVar3 * 8;
    uVar8 = uVar4;
    do {
      uVar1 = P[uVar8 - 1];
      uVar9 = 0;
      puVar11 = mat;
      do {
        if (0x3f < (uint)n) {
          uVar10 = 0;
          do {
            uVar5 = *(undefined8 *)(puVar6 + uVar10 * 8);
            uVar7 = *(undefined8 *)(puVar11 + uVar10 * 8);
            if (uVar9 != uVar1) {
              uVar7 = uVar5;
            }
            *(undefined8 *)(puVar6 + uVar10 * 8) = uVar7;
            if (uVar9 != uVar1) {
              uVar5 = *(undefined8 *)(puVar11 + uVar10 * 8);
            }
            *(undefined8 *)(puVar11 + uVar10 * 8) = uVar5;
            uVar10 = uVar10 + 1;
          } while (uVar3 != uVar10);
        }
        uVar9 = uVar9 + 1;
        puVar11 = puVar11 + (uVar3 << 3);
      } while (uVar9 != uVar4);
      puVar6 = puVar6 + -(ulong)(uVar3 << 3);
      bVar2 = 1 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void undo_perm64(unsigned char *mat, int *P, int n)
{
  uint64_t mask_cpy;
  uint64_t tmp;
  uint64_t *mat_64_ptr = (uint64_t*)mat;

  for(int i = n-1; i >= 0; i--)
  {
    for(int j = 0; j < n; j++)
    {
      mask_cpy = (j == P[i]);
      mask_cpy = -mask_cpy;

      for(int c = 0; c < n/64; c++)
      {
        tmp = mat_64_ptr[(n/64)*i + c];
        mat_64_ptr[(n/64)*i + c] = (mat_64_ptr[(n/64)*i + c] & ~mask_cpy) | (mat_64_ptr[(n/64)*j + c] & mask_cpy);
        mat_64_ptr[(n/64)*j + c] = (mat_64_ptr[(n/64)*j + c] & ~mask_cpy) | (tmp & mask_cpy);
      }
    }
  }
}